

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

void __thiscall embree::FileName::FileName(FileName *this,string *in)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  ulong uVar4;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  if ((this->filename)._M_string_length != 0) {
    uVar4 = 0;
    do {
      pcVar2 = (this->filename)._M_dataplus._M_p;
      cVar1 = pcVar2[uVar4];
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        pcVar2[uVar4] = '/';
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->filename)._M_string_length);
  }
  while ((sVar3 = (this->filename)._M_string_length, sVar3 != 0 &&
         ((this->filename)._M_dataplus._M_p[sVar3 - 1] == '/'))) {
    std::__cxx11::string::resize((ulong)this,(char)sVar3 + -1);
  }
  return;
}

Assistant:

FileName::FileName (const std::string& in) {
    filename = in;
    for (size_t i=0; i<filename.size(); i++)
      if (filename[i] == '\\' || filename[i] == '/')
        filename[i] = path_sep;
    while (!filename.empty() && filename[filename.size()-1] == path_sep)
      filename.resize(filename.size()-1);
  }